

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void leveldb::log::_Test_UnexpectedMiddleType::_RunIt(void)

{
  undefined1 local_98 [8];
  _Test_UnexpectedMiddleType t;
  
  _Test_UnexpectedMiddleType((_Test_UnexpectedMiddleType *)local_98);
  _Run((_Test_UnexpectedMiddleType *)local_98);
  ~_Test_UnexpectedMiddleType((_Test_UnexpectedMiddleType *)local_98);
  return;
}

Assistant:

TEST(LogTest, UnexpectedMiddleType) {
  Write("foo");
  SetByte(6, kMiddleType);
  FixChecksum(0, 3);
  ASSERT_EQ("EOF", Read());
  ASSERT_EQ(3, DroppedBytes());
  ASSERT_EQ("OK", MatchError("missing start"));
}